

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O3

void sse::ProjectionProfile
               (uint32_t rowSize,uint8_t *imageStart,uint32_t height,bool horizontal,uint32_t *out,
               uint32_t simdWidth,uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  byte *pbVar1;
  undefined1 (*pauVar2) [16];
  undefined1 auVar3 [16];
  uint8_t *puVar4;
  undefined7 in_register_00000009;
  uint8_t *puVar5;
  uint32_t uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  undefined1 auVar12 [64];
  undefined1 auVar14 [64];
  undefined1 auVar16 [64];
  undefined1 auVar18 [64];
  
  auVar10 = _DAT_001db4c0;
  if ((int)CONCAT71(in_register_00000009,horizontal) == 0) {
    if (height * rowSize != 0) {
      puVar5 = imageStart + height * rowSize;
      puVar4 = imageStart + totalSimdWidth;
      do {
        auVar12 = ZEXT1664((undefined1  [16])0x0);
        auVar10 = (undefined1  [16])0x0;
        if (simdWidth != 0) {
          lVar7 = 0;
          do {
            pauVar2 = (undefined1 (*) [16])(imageStart + lVar7);
            lVar7 = lVar7 + 0x10;
            auVar10 = vpmovzxbw_avx(*pauVar2);
            auVar15 = vpunpckhbw_avx(*pauVar2,(undefined1  [16])0x0);
            auVar10 = vpaddw_avx(auVar10,auVar15);
            auVar15 = vpmovzxwd_avx(auVar10);
            auVar10 = vpunpckhwd_avx(auVar10,(undefined1  [16])0x0);
            auVar10 = vpaddd_avx(auVar12._0_16_,auVar10);
            auVar10 = vpaddd_avx(auVar10,auVar15);
            auVar12 = ZEXT1664(auVar10);
          } while ((ulong)simdWidth << 4 != lVar7);
        }
        if (nonSimdWidth != 0) {
          uVar6 = *out;
          uVar9 = 0;
          do {
            pbVar1 = puVar4 + uVar9;
            uVar9 = uVar9 + 1;
            uVar6 = uVar6 + *pbVar1;
            *out = uVar6;
          } while (nonSimdWidth != uVar9);
        }
        auVar10 = vphaddd_avx(auVar10,auVar10);
        imageStart = imageStart + rowSize;
        puVar4 = puVar4 + rowSize;
        auVar10 = vphaddd_avx(auVar10,auVar10);
        *out = *out + auVar10._0_4_;
        out = out + 1;
      } while (imageStart != puVar5);
    }
  }
  else {
    puVar5 = imageStart;
    if (totalSimdWidth != 0) {
      puVar5 = imageStart + totalSimdWidth;
      do {
        auVar12 = ZEXT1664((undefined1  [16])0x0);
        auVar11 = (undefined1  [16])0x0;
        auVar14 = ZEXT1664((undefined1  [16])0x0);
        auVar13 = (undefined1  [16])0x0;
        auVar18 = ZEXT1664((undefined1  [16])0x0);
        auVar17 = (undefined1  [16])0x0;
        auVar16 = ZEXT1664((undefined1  [16])0x0);
        auVar15 = (undefined1  [16])0x0;
        if ((ulong)(height * rowSize) != 0) {
          uVar9 = 0;
          do {
            auVar15 = *(undefined1 (*) [16])(imageStart + uVar9);
            uVar9 = uVar9 + rowSize;
            auVar17 = vpmovzxbd_avx(auVar15);
            auVar3 = vpunpckhbw_avx(auVar15,(undefined1  [16])0x0);
            auVar11 = vpshufb_avx(auVar15,auVar10);
            auVar15 = vpaddd_avx(auVar17,auVar16._0_16_);
            auVar16 = ZEXT1664(auVar15);
            auVar13 = vpmovzxwd_avx(auVar3);
            auVar3 = vpunpckhwd_avx(auVar3,(undefined1  [16])0x0);
            auVar17 = vpaddd_avx(auVar18._0_16_,auVar11);
            auVar18 = ZEXT1664(auVar17);
            auVar11 = vpaddd_avx(auVar12._0_16_,auVar3);
            auVar12 = ZEXT1664(auVar11);
            auVar13 = vpaddd_avx(auVar13,auVar14._0_16_);
            auVar14 = ZEXT1664(auVar13);
          } while (height * rowSize != uVar9);
        }
        auVar15 = vpaddd_avx(auVar15,*(undefined1 (*) [16])out);
        imageStart = imageStart + 0x10;
        *(undefined1 (*) [16])out = auVar15;
        auVar15 = vpaddd_avx(auVar17,*(undefined1 (*) [16])((long)out + 0x10));
        *(undefined1 (*) [16])((long)out + 0x10) = auVar15;
        auVar15 = vpaddd_avx(auVar13,*(undefined1 (*) [16])((long)out + 0x20));
        *(undefined1 (*) [16])((long)out + 0x20) = auVar15;
        auVar15 = vpaddd_avx(auVar11,*(undefined1 (*) [16])((long)out + 0x30));
        *(undefined1 (*) [16])((long)out + 0x30) = auVar15;
        out = (uint32_t *)((long)out + 0x40);
      } while (imageStart != puVar5);
    }
    if (nonSimdWidth != 0) {
      puVar4 = puVar5 + nonSimdWidth;
      do {
        if ((ulong)(height * rowSize) != 0) {
          iVar8 = *(int *)*(undefined1 (*) [16])out;
          uVar9 = 0;
          do {
            pbVar1 = puVar5 + uVar9;
            uVar9 = uVar9 + rowSize;
            iVar8 = iVar8 + (uint)*pbVar1;
            *(int *)*(undefined1 (*) [16])out = iVar8;
          } while (height * rowSize != uVar9);
        }
        puVar5 = puVar5 + 1;
        out = (uint32_t *)(*(undefined1 (*) [16])out + 4);
      } while (puVar5 != puVar4);
    }
  }
  return;
}

Assistant:

void ProjectionProfile( uint32_t rowSize, const uint8_t * imageStart, uint32_t height, bool horizontal,
                            uint32_t * out, uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        const simd zero = _mm_setzero_si128();

        if( horizontal ) {
            const uint8_t * imageSimdXEnd = imageStart + totalSimdWidth;

            for( ; imageStart != imageSimdXEnd; imageStart += simdSize, out += simdSize ) {
                const uint8_t * imageSimdY    = imageStart;
                const uint8_t * imageSimdYEnd = imageSimdY + height * rowSize;
                simd simdSum_1 = _mm_setzero_si128();
                simd simdSum_2 = _mm_setzero_si128();
                simd simdSum_3 = _mm_setzero_si128();
                simd simdSum_4 = _mm_setzero_si128();

                simd * dst = reinterpret_cast <simd*> (out);

                for( ; imageSimdY != imageSimdYEnd; imageSimdY += rowSize) {
                    const simd * src    = reinterpret_cast <const simd*> (imageSimdY);

                    const simd data = _mm_loadu_si128( src );

                    const simd dataLo  = _mm_unpacklo_epi8( data, zero );
                    const simd dataHi  = _mm_unpackhi_epi8( data, zero );

                    const simd data_1 = _mm_unpacklo_epi16( dataLo, zero );
                    const simd data_2 = _mm_unpackhi_epi16( dataLo, zero );
                    const simd data_3 = _mm_unpacklo_epi16( dataHi, zero );
                    const simd data_4 = _mm_unpackhi_epi16( dataHi, zero );
                    simdSum_1 = _mm_add_epi32( data_1, simdSum_1 );
                    simdSum_2 = _mm_add_epi32( data_2, simdSum_2 );
                    simdSum_3 = _mm_add_epi32( data_3, simdSum_3 );
                    simdSum_4 = _mm_add_epi32( data_4, simdSum_4 );
                }

                _mm_storeu_si128( dst, _mm_add_epi32( simdSum_1, _mm_loadu_si128( dst ) ) );
                ++dst;
                _mm_storeu_si128( dst, _mm_add_epi32( simdSum_2, _mm_loadu_si128( dst ) ) );
                ++dst;
                _mm_storeu_si128( dst, _mm_add_epi32( simdSum_3, _mm_loadu_si128( dst ) ) );
                ++dst;
                _mm_storeu_si128( dst, _mm_add_epi32( simdSum_4, _mm_loadu_si128( dst ) ) );
            }

            if( nonSimdWidth > 0 ) {
                const uint8_t * imageXEnd = imageStart + nonSimdWidth;

                for( ; imageStart != imageXEnd; ++imageStart, ++out ) {
                    const uint8_t * imageY    = imageStart;
                    const uint8_t * imageYEnd = imageY + height * rowSize;

                    for( ; imageY != imageYEnd; imageY += rowSize )
                        (*out) += (*imageY);
                }
            }
        }
        else {
            const uint8_t * imageYEnd = imageStart + height * rowSize;

            for( ; imageStart != imageYEnd; imageStart += rowSize, ++out ) {
                const simd * src    = reinterpret_cast <const simd*> (imageStart);
                const simd * srcEnd = src + simdWidth;
                simd simdSum = _mm_setzero_si128();

                for( ; src != srcEnd; ++src ) {
                    simd data = _mm_loadu_si128( src );

                    simd dataLo  = _mm_unpacklo_epi8( data, zero );
                    simd dataHi  = _mm_unpackhi_epi8( data, zero );
                    simd sumLoHi = _mm_add_epi16( dataLo, dataHi );

                    simdSum = _mm_add_epi32( simdSum, _mm_add_epi32( _mm_unpacklo_epi16( sumLoHi, zero ),
                                                                     _mm_unpackhi_epi16( sumLoHi, zero ) ) );
                }

                if( nonSimdWidth > 0 ) {
                    const uint8_t * imageX    = imageStart + totalSimdWidth;
                    const uint8_t * imageXEnd = imageX + nonSimdWidth;

                    for( ; imageX != imageXEnd; ++imageX )
                        (*out) += (*imageX);
                }

                uint32_t output[4] = { 0 };
                _mm_storeu_si128( reinterpret_cast <simd*>(output), simdSum );
                
                (*out) += output[0] + output[1] + output[2] + output[3];
            }
        }
    }